

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::pushRead
          (Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this,
          unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
          *v)

{
  unique_lock<std::mutex> *in_RSI;
  long in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::unique_lock<std::mutex>::unique_lock(in_RSI,in_stack_ffffffffffffffb8);
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    std::
    deque<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
    ::push_back((deque<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
                 *)in_RSI,(value_type *)in_stack_ffffffffffffffb8);
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RSI);
  return;
}

Assistant:

void pushRead(std::unique_ptr<T> v) {
    std::unique_lock<std::mutex> lock(m_);
    if (!closed_) {
      write_.push_back(std::move(v));
      cv_.notify_one();
    }
  }